

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

int * __thiscall
JsUtil::
BaseDictionary<unsigned_long,_const_TTD::NSSnapObjects::SnapObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::AllocateBuckets(BaseDictionary<unsigned_long,_const_TTD::NSSnapObjects::SnapObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *this,uint bucketCount)

{
  Memory *this_00;
  HeapAllocator *pHVar1;
  int *piVar2;
  offset_in_HeapAllocator_to_subr AllocFunc;
  TrackAllocData local_40;
  uint local_14;
  BaseDictionary<unsigned_long,_const_TTD::NSSnapObjects::SnapObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBStack_10;
  uint bucketCount_local;
  BaseDictionary<unsigned_long,_const_TTD::NSSnapObjects::SnapObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  pHVar1 = this->alloc;
  local_14 = bucketCount;
  pBStack_10 = this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&int::typeinfo,0,(ulong)bucketCount,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
             ,0x447);
  this_00 = (Memory *)Memory::HeapAllocator::TrackAllocInfo(pHVar1,&local_40);
  pHVar1 = (HeapAllocator *)Memory::TypeAllocatorFunc<Memory::HeapAllocator,_int>::GetAllocFunc();
  piVar2 = Memory::AllocateArray<Memory::HeapAllocator,int,false>
                     (this_00,pHVar1,AllocFunc,(ulong)local_14);
  return piVar2;
}

Assistant:

int *AllocateBuckets(DECLSPEC_GUARD_OVERFLOW const uint bucketCount)
        {
            return
                AllocateArray<AllocatorType, int, false>(
                    TRACK_ALLOC_INFO(alloc, int, AllocatorType, 0, bucketCount),
                    TypeAllocatorFunc<AllocatorType, int>::GetAllocFunc(),
                    bucketCount);
        }